

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O0

bool __thiscall
QSqlRelationalTableModel::removeColumns
          (QSqlRelationalTableModel *this,int column,int count,QModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QSqlRelationalTableModelPrivate *parent_00;
  qsizetype qVar4;
  undefined8 in_RCX;
  int in_EDX;
  uint in_ESI;
  int i;
  QSqlRelationalTableModelPrivate *d;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_2c;
  
  parent_00 = d_func((QSqlRelationalTableModel *)0x15ba79);
  bVar1 = QModelIndex::isValid
                    ((QModelIndex *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if ((!bVar1) && (-1 < (int)in_ESI)) {
    iVar2 = in_ESI + in_EDX;
    iVar3 = QSqlRecord::count((QSqlRecord *)0x15bab0);
    if (iVar2 <= iVar3) {
      for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
        QSqlRecord::remove(&parent_00->baseRec,(char *)(ulong)in_ESI);
        qVar4 = QList<QSharedPointer<QRelation>_>::size(&parent_00->relations);
        if ((int)in_ESI < qVar4) {
          QList<QSharedPointer<QRelation>_>::remove(&parent_00->relations,(char *)(long)(int)in_ESI)
          ;
        }
      }
      bVar1 = QSqlTableModel::removeColumns
                        ((QSqlTableModel *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),
                         (int)in_RCX,(QModelIndex *)parent_00);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool QSqlRelationalTableModel::removeColumns(int column, int count, const QModelIndex &parent)
{
    Q_D(QSqlRelationalTableModel);

    if (parent.isValid() || column < 0 || column + count > d->rec.count())
        return false;

    for (int i = 0; i < count; ++i) {
        d->baseRec.remove(column);
        if (d->relations.size() > column)
            d->relations.remove(column);
    }
    return QSqlTableModel::removeColumns(column, count, parent);
}